

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O1

bool __thiscall SQGenerator::Yield(SQGenerator *this,SQVM *v,SQInteger target)

{
  SQObjectPtrVec *this_00;
  SQUnsignedInteger *pSVar1;
  long *plVar2;
  SQInstruction **ppSVar3;
  SQInteger *pSVar4;
  SQObjectType SVar5;
  SQObjectType SVar6;
  uint uVar7;
  uint uVar8;
  SQObjectPtr *pSVar9;
  SQTable *pSVar10;
  long lVar11;
  SQObjectPtr *pSVar12;
  long *plVar13;
  CallInfo *pCVar14;
  ulong uVar15;
  ulong uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  SQInteger SVar20;
  SQInteger SVar21;
  SQInteger SVar22;
  SQInt32 SVar23;
  SQInt32 SVar24;
  SQInt32 SVar25;
  SQInt32 SVar26;
  SQInt32 SVar27;
  SQObjectType SVar28;
  SQWeakRef *pSVar29;
  SQExceptionTrap *pSVar30;
  SQExceptionTrap *pSVar31;
  SQObjectValue SVar32;
  long lVar33;
  char *s;
  long lVar34;
  SQUnsignedInteger SVar35;
  SQUnsignedInteger SVar36;
  SQObjectPtr local_40;
  
  if (this->_state == eDead) {
    s = "internal vm error, yielding a dead generator";
  }
  else {
    if (this->_state != eSuspended) {
      SVar36 = v->_top - v->_stackbase;
      this_00 = &this->_stack;
      local_40.super_SQObject._unVal.pTable = (SQTable *)0x0;
      local_40.super_SQObject._type = OT_NULL;
      sqvector<SQObjectPtr>::resize(this_00,SVar36,&local_40);
      SQObjectPtr::~SQObjectPtr(&local_40);
      pSVar9 = (v->_stack)._vals;
      SVar5 = pSVar9[v->_stackbase].super_SQObject._type;
      SVar32 = (SQObjectValue)pSVar9[v->_stackbase].super_SQObject._unVal.pRefCounted;
      SVar28 = SVar5;
      if ((SVar5 >> 0x1b & 1) != 0) {
        if (((SVar32.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._weakref ==
            (SQWeakRef *)0x0) {
          pSVar29 = (SQWeakRef *)sq_vm_malloc(0x28);
          (SVar32.pRefCounted)->_weakref = pSVar29;
          (pSVar29->super_SQRefCounted)._uiRef = 0;
          (pSVar29->super_SQRefCounted)._weakref = (SQWeakRef *)0x0;
          (pSVar29->super_SQRefCounted)._vptr_SQRefCounted =
               (_func_int **)&PTR__SQRefCounted_00142bd0;
          pSVar29 = (SVar32.pRefCounted)->_weakref;
          (pSVar29->_obj)._type = SVar5;
          (pSVar29->_obj)._unVal.pRefCounted = (SQRefCounted *)SVar32;
        }
        SVar32 = (SQObjectValue)(SVar32.pRefCounted)->_weakref;
        local_40.super_SQObject._type = OT_WEAKREF;
        local_40.super_SQObject._unVal = SVar32;
        if (SVar32.pTable == (SQTable *)0x0) {
          __assert_fail("_unVal.pTable",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/DaZombieKiller[P]SqNET/squirrel/squirrel/sqobject.h"
                        ,0xec,"SQObjectPtr::SQObjectPtr(SQWeakRef *)");
        }
        pSVar1 = &((SVar32.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef
        ;
        *pSVar1 = *pSVar1 + 1;
        SVar28 = OT_WEAKREF;
      }
      pSVar9 = this_00->_vals;
      SVar6 = (pSVar9->super_SQObject)._type;
      pSVar10 = (pSVar9->super_SQObject)._unVal.pTable;
      (pSVar9->super_SQObject)._unVal.pTable = (SQTable *)SVar32;
      (pSVar9->super_SQObject)._type = SVar28;
      if ((SVar28 >> 0x1b & 1) != 0) {
        pSVar1 = &(((pSVar9->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      if ((SVar6 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar10->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(pSVar10->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
            [2])();
        }
      }
      if ((SVar5 >> 0x1b & 1) != 0) {
        SQObjectPtr::~SQObjectPtr(&local_40);
      }
      if (1 < target) {
        lVar34 = target + -1;
        lVar33 = 0x18;
        do {
          lVar11 = v->_stackbase;
          pSVar9 = (v->_stack)._vals;
          pSVar12 = this_00->_vals;
          uVar7 = *(uint *)((long)pSVar12 + lVar33 + -8);
          plVar13 = *(long **)((long)&(pSVar12->super_SQObject)._type + lVar33);
          *(undefined8 *)((long)&(pSVar12->super_SQObject)._type + lVar33) =
               *(undefined8 *)((long)&pSVar9[lVar11].super_SQObject._type + lVar33);
          uVar8 = *(uint *)((long)pSVar9 + lVar33 + -8 + lVar11 * 0x10);
          *(uint *)((long)pSVar12 + lVar33 + -8) = uVar8;
          if ((uVar8 >> 0x1b & 1) != 0) {
            plVar2 = (long *)(*(long *)((long)&(pSVar12->super_SQObject)._type + lVar33) + 8);
            *plVar2 = *plVar2 + 1;
          }
          if ((uVar7 >> 0x1b & 1) != 0) {
            plVar2 = plVar13 + 1;
            *plVar2 = *plVar2 + -1;
            if (*plVar2 == 0) {
              (**(code **)(*plVar13 + 0x10))();
            }
          }
          lVar33 = lVar33 + 0x10;
          lVar34 = lVar34 + -1;
        } while (lVar34 != 0);
      }
      if (0 < (long)SVar36) {
        lVar33 = 8;
        do {
          lVar34 = v->_stackbase;
          pSVar9 = (v->_stack)._vals;
          plVar13 = *(long **)((long)&pSVar9[lVar34].super_SQObject._type + lVar33);
          uVar7 = *(uint *)((long)pSVar9 + lVar33 + -8 + lVar34 * 0x10);
          *(undefined4 *)((long)pSVar9 + lVar33 + -8 + lVar34 * 0x10) = 0x1000001;
          *(undefined8 *)((long)&pSVar9[lVar34].super_SQObject._type + lVar33) = 0;
          if ((uVar7 >> 0x1b & 1) != 0) {
            plVar2 = plVar13 + 1;
            *plVar2 = *plVar2 + -1;
            if (*plVar2 == 0) {
              (**(code **)(*plVar13 + 0x10))();
            }
          }
          lVar33 = lVar33 + 0x10;
          SVar36 = SVar36 - 1;
        } while (SVar36 != 0);
      }
      pCVar14 = v->ci;
      uVar17 = *(undefined4 *)((long)&pCVar14->_ip + 4);
      uVar18 = *(undefined4 *)&pCVar14->_literals;
      uVar19 = *(undefined4 *)((long)&pCVar14->_literals + 4);
      *(undefined4 *)&(this->_ci)._ip = *(undefined4 *)&pCVar14->_ip;
      *(undefined4 *)((long)&(this->_ci)._ip + 4) = uVar17;
      *(undefined4 *)&(this->_ci)._literals = uVar18;
      *(undefined4 *)((long)&(this->_ci)._literals + 4) = uVar19;
      SVar5 = (this->_ci)._closure.super_SQObject._type;
      pSVar10 = (this->_ci)._closure.super_SQObject._unVal.pTable;
      (this->_ci)._closure.super_SQObject._unVal = (pCVar14->_closure).super_SQObject._unVal;
      SVar28 = (pCVar14->_closure).super_SQObject._type;
      (this->_ci)._closure.super_SQObject._type = SVar28;
      if ((SVar28 >> 0x1b & 1) != 0) {
        pSVar1 = &(((this->_ci)._closure.super_SQObject._unVal.pTable)->super_SQDelegable).
                  super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      if ((SVar5 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar10->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(pSVar10->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
            [2])();
        }
      }
      SVar23 = pCVar14->_etraps;
      SVar24 = pCVar14->_prevstkbase;
      SVar25 = pCVar14->_prevtop;
      SVar26 = pCVar14->_target;
      SVar27 = pCVar14->_ncalls;
      uVar17 = *(undefined4 *)&pCVar14->field_0x3c;
      (this->_ci)._generator = pCVar14->_generator;
      (this->_ci)._etraps = SVar23;
      (this->_ci)._prevstkbase = SVar24;
      (this->_ci)._root = pCVar14->_root;
      (this->_ci)._prevtop = SVar25;
      (this->_ci)._target = SVar26;
      (this->_ci)._ncalls = SVar27;
      *(undefined4 *)&(this->_ci).field_0x3c = uVar17;
      (this->_ci)._generator = (SQGenerator *)0x0;
      if (0 < (this->_ci)._etraps) {
        lVar33 = 0;
        do {
          pSVar31 = (v->_etraps)._vals;
          SVar36 = (v->_etraps)._size;
          uVar15 = (this->_etraps)._size;
          uVar16 = (this->_etraps)._allocated;
          if (uVar16 <= uVar15) {
            SVar35 = uVar15 * 2;
            if (SVar35 == 0) {
              SVar35 = 4;
            }
            pSVar30 = (SQExceptionTrap *)
                      sq_vm_realloc((this->_etraps)._vals,uVar16 << 5,SVar35 << 5);
            (this->_etraps)._vals = pSVar30;
            (this->_etraps)._allocated = SVar35;
          }
          pSVar31 = pSVar31 + (SVar36 - 1);
          pSVar30 = (this->_etraps)._vals;
          SVar36 = (this->_etraps)._size;
          (this->_etraps)._size = SVar36 + 1;
          SVar20 = pSVar31->_stackbase;
          SVar21 = pSVar31->_stacksize;
          SVar22 = pSVar31->_extarget;
          ppSVar3 = &pSVar30[SVar36]._ip;
          *ppSVar3 = pSVar31->_ip;
          ppSVar3[1] = (SQInstruction *)SVar22;
          pSVar30 = pSVar30 + SVar36;
          pSVar30->_stackbase = SVar20;
          pSVar30->_stacksize = SVar21;
          pSVar1 = &(v->_etraps)._size;
          *pSVar1 = *pSVar1 - 1;
          pSVar30 = (this->_etraps)._vals;
          SVar36 = (this->_etraps)._size;
          lVar34 = v->_stackbase;
          pSVar31 = pSVar30 + (SVar36 - 1);
          pSVar31->_stackbase = pSVar31->_stackbase - lVar34;
          pSVar4 = &pSVar30[SVar36 - 1]._stacksize;
          *pSVar4 = *pSVar4 - lVar34;
          lVar33 = lVar33 + 1;
        } while (lVar33 < (this->_ci)._etraps);
      }
      this->_state = eSuspended;
      return true;
    }
    s = "internal vm error, yielding dead generator";
  }
  SQVM::Raise_Error(v,s);
  return false;
}

Assistant:

bool SQGenerator::Yield(SQVM *v,SQInteger target)
{
    if(_state==eSuspended) { v->Raise_Error(_SC("internal vm error, yielding dead generator"));  return false;}
    if(_state==eDead) { v->Raise_Error(_SC("internal vm error, yielding a dead generator")); return false; }
    SQInteger size = v->_top-v->_stackbase;

    _stack.resize(size);
    SQObject _this = v->_stack[v->_stackbase];
    _stack._vals[0] = ISREFCOUNTED(type(_this)) ? SQObjectPtr(_refcounted(_this)->GetWeakRef(type(_this))) : _this;
    for(SQInteger n =1; n<target; n++) {
        _stack._vals[n] = v->_stack[v->_stackbase+n];
    }
    for(SQInteger j =0; j < size; j++)
    {
        v->_stack[v->_stackbase+j].Null();
    }

    _ci = *v->ci;
    _ci._generator=NULL;
    for(SQInteger i=0;i<_ci._etraps;i++) {
        _etraps.push_back(v->_etraps.top());
        v->_etraps.pop_back();
        // store relative stack base and size in case of resume to other _top
        SQExceptionTrap &et = _etraps.back();
        et._stackbase -= v->_stackbase;
        et._stacksize -= v->_stackbase;
    }
    _state=eSuspended;
    return true;
}